

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DeepScanLineInputFile::initialize(DeepScanLineInputFile *this,Header *header)

{
  PixelType PVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  int *piVar6;
  ostream *poVar7;
  ArgExc *pAVar8;
  LineOrder *pLVar9;
  size_type sVar10;
  value_type pLVar11;
  reference ppLVar12;
  bool *pbVar13;
  Compression *maxScanLineSize;
  Compressor *pCVar14;
  Channel *pCVar15;
  char *pcVar16;
  long in_RDI;
  stringstream _iex_throw_s_1;
  ConstIterator i_2;
  ChannelList *c;
  int i_1;
  size_t i;
  int lineOffsetSize;
  Compressor *compressor;
  Box2i *dataWindow;
  stringstream _iex_throw_s;
  const_iterator in_stack_fffffffffffffb88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb90;
  long in_stack_fffffffffffffb98;
  LineBuffer *in_stack_fffffffffffffba0;
  size_type in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb4;
  Header *in_stack_fffffffffffffbe8;
  Header *in_stack_fffffffffffffbf0;
  undefined8 in_stack_fffffffffffffbf8;
  Compression CVar17;
  stringstream local_370 [16];
  ostream local_360 [376];
  const_iterator local_1e8;
  const_iterator local_1e0;
  ChannelList *local_1d8;
  int local_1d0;
  int local_1cc;
  ulong local_1c8;
  int local_1bc;
  Compressor *local_1b8;
  Box2i *local_1b0;
  stringstream local_1a8 [16];
  ostream local_198 [408];
  
  CVar17 = (Compression)((ulong)in_stack_fffffffffffffbf8 >> 0x20);
  Header::type_abi_cxx11_((Header *)0xac4264);
  bVar4 = std::operator!=(in_stack_fffffffffffffb90,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffb88._M_node);
  if (bVar4) {
    pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc
              (pAVar8,"Can\'t build a DeepScanLineInputFile from a type-mismatched part.");
    __cxa_throw(pAVar8,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  piVar6 = Header::version((Header *)0xac42ef);
  if (*piVar6 != 1) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar7 = std::operator<<(local_198,"Version ");
    piVar6 = Header::version((Header *)0xac434d);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,*piVar6);
    std::operator<<(poVar7," not supported for deepscanline images in this version of the library");
    pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar8,local_1a8);
    __cxa_throw(pAVar8,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  Header::operator=(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  pLVar9 = Header::lineOrder((Header *)0xac442a);
  *(LineOrder *)(*(long *)(in_RDI + 8) + 0xd0) = *pLVar9;
  local_1b0 = Header::dataWindow((Header *)0xac445d);
  *(int *)(*(long *)(in_RDI + 8) + 0xd4) = (local_1b0->min).x;
  *(int *)(*(long *)(in_RDI + 8) + 0xd8) = (local_1b0->max).x;
  *(int *)(*(long *)(in_RDI + 8) + 0xdc) = (local_1b0->min).y;
  *(int *)(*(long *)(in_RDI + 8) + 0xe0) = (local_1b0->max).y;
  Array2D<unsigned_int>::resizeErase
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
             in_stack_fffffffffffffba8,(long)in_stack_fffffffffffffba0);
  Array<unsigned_int>::resizeErase
            ((Array<unsigned_int> *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  Header::compression((Header *)0xac4552);
  local_1b8 = newCompressor(CVar17,(size_t)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  iVar5 = numLinesInBuffer((Compressor *)in_stack_fffffffffffffb90);
  *(int *)(*(long *)(in_RDI + 8) + 0x168) = iVar5;
  if (local_1b8 != (Compressor *)0x0) {
    (*local_1b8->_vptr_Compressor[1])();
  }
  *(int *)(*(long *)(in_RDI + 8) + 0x104) = *(int *)(*(long *)(in_RDI + 8) + 0xdc) + -1;
  local_1bc = *(int *)(*(long *)(in_RDI + 8) + 0x168);
  local_1bc = (((local_1b0->max).y - (local_1b0->min).y) + local_1bc) / local_1bc;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),in_stack_fffffffffffffba8
            );
  local_1c8 = 0;
  while( true ) {
    uVar3 = local_1c8;
    sVar10 = std::
             vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
             ::size((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                     *)(*(long *)(in_RDI + 8) + 0x150));
    if (sVar10 <= uVar3) break;
    pLVar11 = (value_type)operator_new(0x88);
    anon_unknown_6::LineBuffer::LineBuffer(in_stack_fffffffffffffba0);
    ppLVar12 = std::
               vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
               ::operator[]((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                             *)(*(long *)(in_RDI + 8) + 0x150),local_1c8);
    *ppLVar12 = pLVar11;
    local_1c8 = local_1c8 + 1;
  }
  Array<bool>::resizeErase((Array<bool> *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  for (local_1cc = 0;
      local_1cc <
      (*(int *)(*(long *)(in_RDI + 8) + 0xe0) - *(int *)(*(long *)(in_RDI + 8) + 0xdc)) + 1;
      local_1cc = local_1cc + 1) {
    pbVar13 = Array::operator_cast_to_bool_((Array *)(*(long *)(in_RDI + 8) + 0x1b0));
    pbVar13[local_1cc] = false;
  }
  lVar2 = *(long *)(in_RDI + 8);
  local_1d0 = (*(int *)(lVar2 + 0xe0) - *(int *)(lVar2 + 0xdc)) + 1;
  piVar6 = std::min<int>((int *)(lVar2 + 0x168),&local_1d0);
  lVar2 = *(long *)(in_RDI + 8);
  *(int *)(lVar2 + 500) = *piVar6 * ((*(int *)(lVar2 + 0xd8) - *(int *)(lVar2 + 0xd4)) + 1) * 4;
  Array<char>::resizeErase(&in_stack_fffffffffffffba0->buffer,in_stack_fffffffffffffb98);
  CVar17 = (Compression)((ulong)piVar6 >> 0x20);
  maxScanLineSize = Header::compression((Header *)0xac4873);
  pCVar14 = newCompressor(CVar17,(size_t)maxScanLineSize,in_stack_fffffffffffffbe8);
  *(Compressor **)(*(long *)(in_RDI + 8) + 0x1e8) = pCVar14;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),in_stack_fffffffffffffba8
            );
  local_1d8 = Header::channels((Header *)0xac48f1);
  *(undefined4 *)(*(long *)(in_RDI + 8) + 0x1f0) = 0;
  local_1e0._M_node = (_Base_ptr)ChannelList::begin(in_stack_fffffffffffffb88._M_node);
  do {
    local_1e8._M_node = (_Base_ptr)ChannelList::end(in_stack_fffffffffffffb88._M_node);
    bVar4 = Imf_2_5::operator!=((ConstIterator *)in_stack_fffffffffffffb90,
                                (ConstIterator *)in_stack_fffffffffffffb88._M_node);
    if (!bVar4) {
      return;
    }
    pCVar15 = ChannelList::ConstIterator::channel((ConstIterator *)0xac4992);
    PVar1 = pCVar15->type;
    if (PVar1 == UINT) {
      iVar5 = Xdr::size<unsigned_int>();
      *(int *)(*(long *)(in_RDI + 8) + 0x1f0) = iVar5 + *(int *)(*(long *)(in_RDI + 8) + 0x1f0);
    }
    else if (PVar1 == HALF) {
      iVar5 = Xdr::size<half>();
      *(int *)(*(long *)(in_RDI + 8) + 0x1f0) = iVar5 + *(int *)(*(long *)(in_RDI + 8) + 0x1f0);
    }
    else {
      if (PVar1 != FLOAT) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_370);
        poVar7 = std::operator<<(local_360,"Bad type for channel ");
        pcVar16 = ChannelList::ConstIterator::name((ConstIterator *)0xac4a87);
        poVar7 = std::operator<<(poVar7,pcVar16);
        std::operator<<(poVar7," initializing deepscanline reader");
        pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar8,local_370);
        __cxa_throw(pAVar8,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      iVar5 = Xdr::size<float>();
      *(int *)(*(long *)(in_RDI + 8) + 0x1f0) = iVar5 + *(int *)(*(long *)(in_RDI + 8) + 0x1f0);
    }
    in_stack_fffffffffffffb88._M_node =
         (_Base_ptr)ChannelList::ConstIterator::operator++(in_stack_fffffffffffffb88._M_node,0);
  } while( true );
}

Assistant:

void DeepScanLineInputFile::initialize(const Header& header)
{
    try
    {
        if (header.type() != DEEPSCANLINE)
            throw IEX_NAMESPACE::ArgExc("Can't build a DeepScanLineInputFile from "
            "a type-mismatched part.");
        
        if(header.version()!=1)
        {
            THROW(IEX_NAMESPACE::ArgExc, "Version " << header.version() << " not supported for deepscanline images in this version of the library");
        }
        
        _data->header = header;

        _data->lineOrder = _data->header.lineOrder();

        const Box2i &dataWindow = _data->header.dataWindow();

        _data->minX = dataWindow.min.x;
        _data->maxX = dataWindow.max.x;
        _data->minY = dataWindow.min.y;
        _data->maxY = dataWindow.max.y;

        _data->sampleCount.resizeErase(_data->maxY - _data->minY + 1,
                                       _data->maxX - _data->minX + 1);
        _data->lineSampleCount.resizeErase(_data->maxY - _data->minY + 1);

        Compressor* compressor = newCompressor(_data->header.compression(),
                                               0,
                                               _data->header);

        _data->linesInBuffer = numLinesInBuffer (compressor);

        delete compressor;

        _data->nextLineBufferMinY = _data->minY - 1;

        int lineOffsetSize = (dataWindow.max.y - dataWindow.min.y +
                              _data->linesInBuffer) / _data->linesInBuffer;

        _data->lineOffsets.resize (lineOffsetSize);

        for (size_t i = 0; i < _data->lineBuffers.size(); i++)
            _data->lineBuffers[i] = new LineBuffer ();

        _data->gotSampleCount.resizeErase(_data->maxY - _data->minY + 1);
        for (int i = 0; i < _data->maxY - _data->minY + 1; i++)
            _data->gotSampleCount[i] = false;

        _data->maxSampleCountTableSize = min(_data->linesInBuffer, _data->maxY - _data->minY + 1) *
                                        (_data->maxX - _data->minX + 1) *
                                        sizeof(unsigned int);

        _data->sampleCountTableBuffer.resizeErase(_data->maxSampleCountTableSize);

        _data->sampleCountTableComp = newCompressor(_data->header.compression(),
                                                    _data->maxSampleCountTableSize,
                                                    _data->header);

        _data->bytesPerLine.resize (_data->maxY - _data->minY + 1);
        
        const ChannelList & c=header.channels();
        
        _data->combinedSampleSize=0;
        for(ChannelList::ConstIterator i=c.begin();i!=c.end();i++)
        {
            switch(i.channel().type)
            {
                case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF  :
                    _data->combinedSampleSize+=Xdr::size<half>();
                    break;
                case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT :
                    _data->combinedSampleSize+=Xdr::size<float>();
                    break;
                case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT  :
                    _data->combinedSampleSize+=Xdr::size<unsigned int>();
                    break;
                default :
                    THROW(IEX_NAMESPACE::ArgExc, "Bad type for channel " << i.name() << " initializing deepscanline reader");
                    
            }
        }
        
    }
    catch (...)
    {
        // Don't delete _data here, leave that to caller
        throw;
    }
}